

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<char16_t>::~Vector(Vector<char16_t> *this)

{
  char16_t *pcVar1;
  RemoveConst<char16_t> *pRVar2;
  char16_t *pcVar3;
  ArrayDisposer *pAVar4;
  
  pcVar1 = (this->builder).ptr;
  if (pcVar1 != (char16_t *)0x0) {
    pRVar2 = (this->builder).pos;
    pcVar3 = (this->builder).endPtr;
    (this->builder).ptr = (char16_t *)0x0;
    (this->builder).pos = (RemoveConst<char16_t> *)0x0;
    (this->builder).endPtr = (char16_t *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pcVar1,2,(long)pRVar2 - (long)pcVar1 >> 1,(long)pcVar3 - (long)pcVar1 >> 1,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }